

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

bool __thiscall ClipperLib::Clipper::ProcessIntersections(Clipper *this,long64 botY,long64 topY)

{
  bool bVar1;
  long64 topY_local;
  long64 botY_local;
  Clipper *this_local;
  
  if (this->m_ActiveEdges == (TEdge *)0x0) {
    this_local._7_1_ = true;
  }
  else {
    BuildIntersectList(this,botY,topY);
    if (this->m_IntersectNodes == (IntersectNode *)0x0) {
      this_local._7_1_ = true;
    }
    else {
      bVar1 = FixupIntersections(this);
      if (bVar1) {
        ProcessIntersectList(this);
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Clipper::ProcessIntersections(const long64 botY, const long64 topY)
{
  if( !m_ActiveEdges ) return true;
  try {
    BuildIntersectList(botY, topY);
    if ( !m_IntersectNodes) return true;
    if ( FixupIntersections() ) ProcessIntersectList();
    else return false;
  }
  catch(...) {
    m_SortedEdges = 0;
    DisposeIntersectNodes();
    throw clipperException("ProcessIntersections error");
  }
  return true;
}